

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.hh
# Opt level: O3

void __thiscall AddrSpace::~AddrSpace(AddrSpace *this)

{
  pointer pcVar1;
  
  this->_vptr_AddrSpace = (_func_int **)&PTR__AddrSpace_003bd630;
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->name).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

virtual ~AddrSpace(void) {}